

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O2

bool __thiscall irr::video::COpenGLSLMaterialRenderer::linkProgram(COpenGLSLMaterialRenderer *this)

{
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *paVar1;
  GLuint GVar2;
  GLint GVar3;
  char *pcVar4;
  Printer *this_00;
  long lVar5;
  code *pcVar6;
  ulong uVar7;
  GLint i;
  int iVar8;
  double in_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  GLint num;
  GLint maxlen;
  GLint status;
  GLint size;
  GLint maxLength;
  uint uStack_54;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [4];
  GLint local_34;
  
  lVar5 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
  if (this->Program2 == 0) {
    if (*(code **)(lVar5 + 0x750) != (code *)0x0) {
      in_XMM0_Qa = (double)(**(code **)(lVar5 + 0x750))(this->Program);
      lVar5 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
    }
    status = 0;
    if ((*(code **)(lVar5 + 0x7d8) != (code *)0x0) &&
       (in_XMM0_Qa = (double)(**(code **)(lVar5 + 0x7d8))(this->Program,0x8b82,&status), status != 0
       )) {
      num = 0;
      pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
      if (pcVar6 == (code *)0x0) {
        return true;
      }
      dVar9 = (double)(*pcVar6)(this->Program,0x8b86,&num);
      if (num == 0) {
        return true;
      }
      maxlen = 0;
      pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
      if (pcVar6 != (code *)0x0) {
        dVar9 = (double)(*pcVar6)(this->Program,0x8b87,&maxlen);
        if ((long)maxlen != 0) {
          uVar7 = (long)maxlen + 1;
          maxlen = (GLint)uVar7;
          pcVar4 = (char *)operator_new__(uVar7);
          paVar1 = &this->UniformInfo;
          core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::clear(paVar1);
          core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
                    (paVar1,num,true);
          for (iVar8 = 0; GVar3 = maxlen, iVar8 < num; iVar8 = iVar8 + 1) {
            _maxLength = (pointer)&local_48;
            local_50 = 0;
            local_48._M_local_buf[0] = '\0';
            memset(pcVar4,0,(long)maxlen);
            pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x8a8);
            if (pcVar6 != (code *)0x0) {
              (*pcVar6)(this->Program,iVar8,GVar3,0,&size,local_38,pcVar4);
            }
            core::string<char>::operator=((string<char> *)&maxLength,pcVar4);
            pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7f0);
            if (pcVar6 == (code *)0x0) {
              local_34 = 0;
            }
            else {
              local_34 = (*pcVar6)(this->Program,pcVar4);
            }
            core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::push_back
                      (paVar1,(SUniformInfo *)&maxLength);
            ::std::__cxx11::string::_M_dispose();
          }
          goto LAB_002077b3;
        }
      }
      pcVar4 = "GLSL: failed to retrieve uniform information";
      goto LAB_002077cf;
    }
    os::Printer::log((Printer *)"GLSL shader program failed to link",in_XMM0_Qa);
    _maxLength = (pointer)((ulong)uStack_54 << 0x20);
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
    if (pcVar6 == (code *)0x0) {
      return false;
    }
    (*pcVar6)(this->Program,0x8b84,&maxLength);
    uVar7 = (ulong)maxLength;
    if (uVar7 == 0) {
      return false;
    }
    this_00 = (Printer *)operator_new__(uVar7);
    GVar2 = this->Program;
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7c0);
    dVar9 = extraout_XMM0_Qa_00;
  }
  else {
    if (*(code **)(lVar5 + 0x7b8) != (code *)0x0) {
      in_XMM0_Qa = (double)(**(code **)(lVar5 + 0x7b8))();
      lVar5 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
    }
    status = 0;
    if ((*(code **)(lVar5 + 0x7e8) != (code *)0x0) &&
       (in_XMM0_Qa = (double)(**(code **)(lVar5 + 0x7e8))(this->Program2,0x8b82,&status),
       status != 0)) {
      num = 0;
      pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
      if (pcVar6 == (code *)0x0) {
        return true;
      }
      dVar9 = (double)(*pcVar6)(this->Program2,0x8b86,&num);
      if (num == 0) {
        return true;
      }
      maxlen = 0;
      pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
      if (pcVar6 != (code *)0x0) {
        dVar9 = (double)(*pcVar6)(this->Program2,0x8b87,&maxlen);
        if ((long)maxlen != 0) {
          uVar7 = (long)maxlen + 1;
          maxlen = (GLint)uVar7;
          pcVar4 = (char *)operator_new__(uVar7);
          paVar1 = &this->UniformInfo;
          core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::clear(paVar1);
          core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
                    (paVar1,num,true);
          for (iVar8 = 0; GVar3 = maxlen, iVar8 < num; iVar8 = iVar8 + 1) {
            _maxLength = (pointer)&local_48;
            local_50 = 0;
            local_48._M_local_buf[0] = '\0';
            memset(pcVar4,0,(long)maxlen);
            pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x8b0);
            if (pcVar6 != (code *)0x0) {
              (*pcVar6)(this->Program2,iVar8,GVar3,0,&size,local_38,pcVar4);
            }
            core::string<char>::operator=((string<char> *)&maxLength,pcVar4);
            pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7f8);
            if (pcVar6 == (code *)0x0) {
              local_34 = 0;
            }
            else {
              local_34 = (*pcVar6)(this->Program2,pcVar4);
            }
            core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::push_back
                      (paVar1,(SUniformInfo *)&maxLength);
            ::std::__cxx11::string::_M_dispose();
          }
LAB_002077b3:
          operator_delete__(pcVar4);
          return true;
        }
      }
      pcVar4 = "GLSL (> 2.x): failed to retrieve uniform information";
LAB_002077cf:
      os::Printer::log((Printer *)pcVar4,dVar9);
      return false;
    }
    os::Printer::log((Printer *)"GLSL (> 2.x) shader program failed to link",in_XMM0_Qa);
    _maxLength = (pointer)((ulong)uStack_54 << 0x20);
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
    if (pcVar6 == (code *)0x0) {
      return false;
    }
    (*pcVar6)(this->Program2,0x8b84,&maxLength);
    uVar7 = (ulong)maxLength;
    if (uVar7 == 0) {
      return false;
    }
    this_00 = (Printer *)operator_new__(uVar7);
    GVar2 = this->Program2;
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 2000);
    dVar9 = extraout_XMM0_Qa;
  }
  num = 0;
  if (pcVar6 != (code *)0x0) {
    dVar9 = (double)(*pcVar6)(GVar2,uVar7 & 0xffffffff,&num,this_00);
  }
  os::Printer::log(this_00,dVar9);
  operator_delete__(this_00);
  return false;
}

Assistant:

bool COpenGLSLMaterialRenderer::linkProgram()
{
	if (Program2) {
		Driver->extGlLinkProgram(Program2);

		GLint status = 0;

#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_LINK_STATUS, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL (> 2.x) shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_VERSION_2_0
			Driver->extGlGetProgramiv(Program2, GL_INFO_LOG_LENGTH, &maxLength);
#endif
			if (maxLength) {
				GLchar *infoLog = new GLchar[maxLength];
				Driver->extGlGetProgramInfoLog(Program2, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORMS, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORM_MAX_LENGTH, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL (> 2.x): failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (GLint i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniform(Program2, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLchar *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocation(Program2, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	} else {
		Driver->extGlLinkProgramARB(Program);

		GLint status = 0;

#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_LINK_STATUS_ARB, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_ARB_shader_objects
			Driver->extGlGetObjectParameteriv(Program,
					GL_OBJECT_INFO_LOG_LENGTH_ARB, &maxLength);
#endif
			if (maxLength) {
				GLcharARB *infoLog = new GLcharARB[maxLength];
				Driver->extGlGetInfoLog(Program, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORMS_ARB, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORM_MAX_LENGTH_ARB, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL: failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (int i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniformARB(Program, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLcharARB *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocationARB(Program, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	}

	return true;
}